

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O2

Expression * soul::ExpressionHelpers::createPrimitive(Expression *__return_storage_ptr__,string *s)

{
  undefined1 local_50 [40];
  _Alloc_hider local_28;
  size_type local_20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_18;
  
  local_50._0_4_ = primitive;
  std::__cxx11::string::string((string *)(local_50 + 8),(string *)s);
  local_28._M_p = (pointer)&local_18;
  local_20 = 0;
  local_18._M_local_buf[0] = '\0';
  fromSection(__return_storage_ptr__,(Section *)local_50);
  SourceCodeModel::Expression::Section::~Section((Section *)local_50);
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeModel::Expression createPrimitive    (std::string s) { return fromSection ({ SourceCodeModel::Expression::Section::Type::primitive,  std::move (s) }); }